

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O2

QRect QStyle::alignedRect(LayoutDirection direction,Alignment alignment,QSize *size,QRect *rectangle
                         )

{
  int iVar1;
  int iVar2;
  Alignment AVar3;
  QSize QVar4;
  int iVar5;
  int iVar6;
  QRect QVar7;
  
  AVar3 = QGuiApplicationPrivate::visualAlignment(direction,alignment);
  iVar6 = (rectangle->x1).m_i;
  iVar5 = (rectangle->y1).m_i;
  iVar1 = (size->wd).m_i;
  iVar2 = (size->ht).m_i;
  if ((char)AVar3.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
            super_QFlagsStorage<Qt::AlignmentFlag>.i < '\0') {
    QVar4 = QRect::size(rectangle);
    iVar5 = iVar5 + QVar4.ht.m_i.m_i / 2 + iVar2 / -2;
  }
  else if (((uint)AVar3.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x40) != 0) {
    QVar4 = QRect::size(rectangle);
    iVar5 = (iVar5 - iVar2) + QVar4.ht.m_i.m_i;
  }
  if (((uint)AVar3.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 2) == 0) {
    if (((uint)AVar3.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 4) != 0) {
      QVar4 = QRect::size(rectangle);
      iVar6 = iVar6 + (int)((long)((ulong)(uint)(QVar4.wd.m_i.m_i >> 0x1f) << 0x20 |
                                  (ulong)QVar4 & 0xffffffff) / 2) + iVar1 / -2;
    }
  }
  else {
    QVar4 = QRect::size(rectangle);
    iVar6 = (iVar6 - iVar1) + QVar4.wd.m_i.m_i;
  }
  QVar7.x2.m_i = iVar1 + iVar6 + -1;
  QVar7.y1.m_i = iVar5;
  QVar7.x1.m_i = iVar6;
  QVar7.y2.m_i = iVar2 + iVar5 + -1;
  return QVar7;
}

Assistant:

QRect QStyle::alignedRect(Qt::LayoutDirection direction, Qt::Alignment alignment, const QSize &size, const QRect &rectangle)
{
    alignment = visualAlignment(direction, alignment);
    int x = rectangle.x();
    int y = rectangle.y();
    int w = size.width();
    int h = size.height();
    if ((alignment & Qt::AlignVCenter) == Qt::AlignVCenter)
        y += rectangle.size().height()/2 - h/2;
    else if ((alignment & Qt::AlignBottom) == Qt::AlignBottom)
        y += rectangle.size().height() - h;
    if ((alignment & Qt::AlignRight) == Qt::AlignRight)
        x += rectangle.size().width() - w;
    else if ((alignment & Qt::AlignHCenter) == Qt::AlignHCenter)
        x += rectangle.size().width()/2 - w/2;
    return QRect(x, y, w, h);
}